

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

int Gia_ManComputeOverlap2One(Gia_Man_t *p,int iObj,Vec_Str_t *vLabel,Vec_Int_t *vVisit)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int local_30;
  int Counter;
  int k;
  int iFan;
  Vec_Int_t *vVisit_local;
  Vec_Str_t *vLabel_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  Vec_IntClear(vVisit);
  for (local_30 = 0; iVar1 = Gia_ObjLutSize(p,iObj), local_30 < iVar1; local_30 = local_30 + 1) {
    piVar3 = Gia_ObjLutFanins(p,iObj);
    Vec_StrWriteEntry(vLabel,piVar3[local_30],'\x01');
  }
  iVar1 = Gia_ManComputeOverlap2One_rec(p,iObj,vLabel,vVisit);
  for (local_30 = 0; iVar2 = Gia_ObjLutSize(p,iObj), local_30 < iVar2; local_30 = local_30 + 1) {
    piVar3 = Gia_ObjLutFanins(p,iObj);
    Vec_StrWriteEntry(vLabel,piVar3[local_30],'\0');
  }
  for (local_30 = 0; iVar2 = Vec_IntSize(vVisit), local_30 < iVar2; local_30 = local_30 + 1) {
    iVar2 = Vec_IntEntry(vVisit,local_30);
    Vec_StrWriteEntry(vLabel,iVar2,'\0');
  }
  return iVar1;
}

Assistant:

int Gia_ManComputeOverlap2One( Gia_Man_t * p, int iObj, Vec_Str_t * vLabel, Vec_Int_t * vVisit )
{
    int iFan, k, Counter;
    Vec_IntClear( vVisit );
    Gia_LutForEachFanin( p, iObj, iFan, k )
        Vec_StrWriteEntry( vLabel, iFan, 1 );
    Counter = Gia_ManComputeOverlap2One_rec( p, iObj, vLabel, vVisit );
    Gia_LutForEachFanin( p, iObj, iFan, k )
        Vec_StrWriteEntry( vLabel, iFan, 0 );
    Vec_IntForEachEntry( vVisit, iFan, k )
        Vec_StrWriteEntry( vLabel, iFan, 0 );
    return Counter;
}